

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O0

void __thiscall HighsIis::removeRow(HighsIis *this,HighsInt row)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  int in_ESI;
  size_type in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  HighsInt num_row;
  size_type __new_size;
  
  __new_size = in_RDI;
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)((int)sVar2 + -1));
  vVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)in_ESI);
  *pvVar3 = vVar1;
  std::vector<int,_std::allocator<int>_>::resize(unaff_retaddr,__new_size);
  return;
}

Assistant:

void HighsIis::removeRow(const HighsInt row) {
  HighsInt num_row = this->row_index_.size();
  assert(row < num_row);
  this->row_index_[row] = this->row_index_[num_row - 1];
  this->row_index_.resize(num_row - 1);
}